

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

int __thiscall
CVmObjIterLookupTable::getp_reset_iter
          (CVmObjIterLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  
  if (getp_reset_iter(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_reset_iter();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_reset_iter::desc);
  if (iVar1 == 0) {
    set_entry_index_undo(this,self,0);
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjIterLookupTable::getp_reset_iter(VMG_ vm_obj_id_t self,
                                           vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set our entry index back to zero, saving undo */
    set_entry_index_undo(vmg_ self, 0);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}